

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_GiaPrintSubgraph_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  
  uVar1 = (uint)*(ulong *)pObj;
  if ((~uVar1 & 0x9fffffff) == 0 || (uVar1 >> 0x1e & 1) == 0) {
    return;
  }
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
  if ((-1 < (int)uVar1) && ((uVar1 & 0x1fffffff) != 0x1fffffff)) {
    Lms_GiaPrintSubgraph_rec(p,pObj + -(ulong)(uVar1 & 0x1fffffff));
    Lms_GiaPrintSubgraph_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    Gia_ObjPrint(p,pObj);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                ,0x114,"void Lms_GiaPrintSubgraph_rec(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Lms_GiaPrintSubgraph_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return;
    pObj->fMark0 = 0;
    assert( Gia_ObjIsAnd(pObj) );
    Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin0(pObj) );
    Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin1(pObj) );
    Gia_ObjPrint( p, pObj );
}